

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_reverse_remove_op_r(lyd_node *diff,lyd_diff_op op)

{
  lyd_diff_op lVar1;
  lyd_meta *meta_00;
  char *str;
  lysc_ext_instance *plVar2;
  ly_ctx *ctx;
  lyd_meta *plVar3;
  lyd_node *LYD_TREE_DFS_next;
  ly_bool LYD_TREE_DFS_continue;
  lyd_meta *meta;
  lyd_node *elem;
  lyd_diff_op op_local;
  lyd_node *diff_local;
  
  plVar2 = (lysc_ext_instance *)diff;
  do {
    meta = (lyd_meta *)plVar2;
    if (meta == (lyd_meta *)0x0) {
      return LY_SUCCESS;
    }
    plVar3 = meta;
    meta_00 = lyd_find_meta((lyd_meta *)(meta->value).realtype,(lys_module *)0x0,"yang:operation");
    if (meta_00 != (lyd_meta *)0x0) {
      str = lyd_get_meta_value(meta_00);
      lVar1 = lyd_diff_str2op(str);
      if (lVar1 != op) {
        if (diff->schema == (lysc_node *)0x0) {
          ctx = (ly_ctx *)diff[2].schema;
        }
        else {
          ctx = diff->schema->module->ctx;
        }
        ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x8b5
               ,ctx,plVar3);
        return LY_EINT;
      }
      lyd_free_meta_single(meta_00);
    }
    plVar2 = (lysc_ext_instance *)lyd_child((lyd_node *)meta);
    if (plVar2 == (lysc_ext_instance *)0x0) {
      if (meta == (lyd_meta *)diff) {
        return LY_SUCCESS;
      }
      plVar2 = (lysc_ext_instance *)meta->name;
    }
    while ((plVar2 == (lysc_ext_instance *)0x0 &&
           (meta = (lyd_meta *)meta->annotation,
           ((lysc_ext_instance *)meta)->module != (lys_module *)diff->parent))) {
      plVar2 = ((lysc_ext_instance *)meta)->exts;
    }
  } while( true );
}

Assistant:

static LY_ERR
lyd_diff_reverse_remove_op_r(struct lyd_node *diff, enum lyd_diff_op op)
{
    struct lyd_node *elem;
    struct lyd_meta *meta;

    LYD_TREE_DFS_BEGIN(diff, elem) {
        meta = lyd_find_meta(elem->meta, NULL, "yang:operation");
        if (meta) {
            LY_CHECK_ERR_RET(lyd_diff_str2op(lyd_get_meta_value(meta)) != op, LOGINT(LYD_CTX(diff)), LY_EINT);
            lyd_free_meta_single(meta);
        }

        LYD_TREE_DFS_END(diff, elem);
    }

    return LY_SUCCESS;
}